

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslayoutitem.cpp
# Opt level: O3

QSizeF * __thiscall
QGraphicsLayoutItemPrivate::effectiveSizeHints(QGraphicsLayoutItemPrivate *this,QSizeF *constraint)

{
  QSizeF *maximum;
  qreal *minimum;
  qreal *preferred;
  qreal *maximum_00;
  double *pdVar1;
  QGraphicsLayoutItem *pQVar2;
  QSizeF *pQVar3;
  bool bVar4;
  bool bVar5;
  qreal qVar6;
  bool bVar7;
  long lVar8;
  QSizeF *minimum_00;
  qreal extraout_XMM0_Qa;
  qreal extraout_XMM0_Qa_00;
  double dVar9;
  qreal extraout_XMM0_Qa_01;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pQVar2 = this->q_ptr;
  bVar4 = constraint->wd < 0.0;
  bVar5 = constraint->ht < 0.0;
  if (bVar5 && bVar4) {
    minimum_00 = this->cachedSizeHints;
    if ((this->field_0xb0 & 1) == 0) {
      return minimum_00;
    }
  }
  else {
    if (((this->field_0xb0 & 2) == 0) &&
       (bVar7 = qFuzzyCompare(constraint,&this->cachedConstraint), bVar7)) {
      return this->cachedSizeHintsWithConstraints;
    }
    minimum_00 = this->cachedSizeHintsWithConstraints;
  }
  lVar8 = 0;
  do {
    dVar10 = constraint->wd;
    dVar13 = constraint->ht;
    pdVar1 = (double *)((long)&minimum_00->wd + lVar8);
    *pdVar1 = dVar10;
    pdVar1[1] = dVar13;
    pQVar3 = this->userSizeHints;
    if (pQVar3 != (QSizeF *)0x0) {
      pdVar1 = (double *)((long)&minimum_00->wd + lVar8);
      dVar10 = *(double *)((long)&pQVar3->ht + lVar8);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        *pdVar1 = *(double *)((long)&pQVar3->wd + lVar8);
      }
      pdVar1 = (double *)((long)&minimum_00->ht + lVar8);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        *(double *)((long)&minimum_00->ht + lVar8) = dVar10;
      }
    }
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  pQVar3 = minimum_00 + 1;
  maximum = minimum_00 + 2;
  normalizeHints(&minimum_00->wd,&pQVar3->wd,&maximum->wd,&minimum_00[3].wd);
  minimum = &minimum_00->ht;
  preferred = &minimum_00[1].ht;
  maximum_00 = &minimum_00[2].ht;
  normalizeHints(minimum,preferred,maximum_00,&minimum_00[3].ht);
  dVar13 = minimum_00[2].wd;
  if ((dVar13 < 0.0) || (dVar14 = *maximum_00, dVar14 < 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,2,maximum);
    dVar13 = maximum->wd;
    if (dVar13 < 0.0) {
      maximum->wd = extraout_XMM0_Qa;
      dVar13 = extraout_XMM0_Qa;
    }
    dVar14 = *maximum_00;
    if (*maximum_00 < 0.0) {
      *maximum_00 = dVar10;
      dVar14 = dVar10;
    }
    if (dVar13 < 0.0) {
      maximum->wd = 16777215.0;
      dVar13 = 16777215.0;
    }
  }
  dVar10 = 0.0;
  if (dVar14 < 0.0) {
    *maximum_00 = 16777215.0;
    dVar14 = 16777215.0;
  }
  dVar12 = pQVar3->wd;
  dVar9 = *preferred;
  if ((0.0 <= dVar12) && (dVar13 < dVar12)) {
    maximum->wd = dVar12;
    dVar13 = dVar12;
  }
  if ((0.0 <= dVar9) && (dVar14 < dVar9)) {
    *maximum_00 = dVar9;
    dVar14 = dVar9;
  }
  dVar12 = minimum_00->wd;
  dVar9 = minimum_00->ht;
  if ((0.0 <= dVar12) && (dVar13 < dVar12)) {
    maximum->wd = dVar12;
    dVar13 = dVar12;
  }
  if ((0.0 <= dVar9) && (dVar14 < dVar9)) {
    *maximum_00 = dVar9;
    dVar14 = dVar9;
  }
  if (16777215.0 < dVar13) {
    maximum->wd = 16777215.0;
  }
  if (16777215.0 < dVar14) {
    *maximum_00 = 16777215.0;
  }
  if ((dVar12 < 0.0) || (dVar9 < 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,0,minimum_00);
    dVar12 = minimum_00->wd;
    if (dVar12 < 0.0) {
      minimum_00->wd = extraout_XMM0_Qa_00;
      dVar12 = extraout_XMM0_Qa_00;
    }
    dVar9 = *minimum;
    if (*minimum < 0.0) {
      *minimum = dVar10;
      dVar9 = dVar10;
    }
    if (dVar12 < 0.0) {
      minimum_00->wd = 0.0;
      dVar12 = 0.0;
    }
  }
  if (dVar9 < 0.0) {
    *minimum = 0.0;
    dVar9 = 0.0;
  }
  dVar10 = pQVar3->wd;
  dVar13 = *preferred;
  if ((0.0 <= dVar10) && (dVar10 < dVar12)) {
    minimum_00->wd = dVar10;
    dVar12 = dVar10;
  }
  if ((0.0 <= dVar13) && (dVar13 < dVar9)) {
    *minimum = dVar13;
    dVar9 = dVar13;
  }
  dVar14 = maximum->wd;
  dVar11 = *maximum_00;
  if ((0.0 <= dVar14) && (dVar14 < dVar12)) {
    minimum_00->wd = dVar14;
  }
  if ((0.0 <= dVar11) && (dVar11 < dVar9)) {
    *minimum = dVar11;
  }
  if ((dVar10 < 0.0) || (dVar13 < 0.0)) {
    (*pQVar2->_vptr_QGraphicsLayoutItem[6])(pQVar2,1,pQVar3);
    dVar10 = pQVar3->wd;
    if (dVar10 < 0.0) {
      pQVar3->wd = extraout_XMM0_Qa_01;
      dVar10 = extraout_XMM0_Qa_01;
    }
    dVar13 = *preferred;
    if (*preferred < 0.0) {
      *preferred = dVar11;
      dVar13 = dVar11;
    }
  }
  dVar14 = minimum_00->wd;
  dVar12 = minimum_00->ht;
  if ((0.0 <= dVar14) && (dVar10 < dVar14)) {
    pQVar3->wd = dVar14;
    dVar10 = dVar14;
  }
  if ((0.0 <= dVar12) && (dVar13 < dVar12)) {
    *preferred = dVar12;
    dVar13 = dVar12;
  }
  dVar14 = maximum->wd;
  dVar12 = *maximum_00;
  if ((0.0 <= dVar14) && (dVar14 < dVar10)) {
    pQVar3->wd = dVar14;
  }
  if ((0.0 <= dVar12) && (dVar12 < dVar13)) {
    *preferred = dVar12;
  }
  if (bVar5 && bVar4) {
    this->field_0xb0 = this->field_0xb0 & 0xfe;
  }
  else {
    qVar6 = constraint->ht;
    (this->cachedConstraint).wd = constraint->wd;
    (this->cachedConstraint).ht = qVar6;
    this->field_0xb0 = this->field_0xb0 & 0xfd;
  }
  return minimum_00;
}

Assistant:

QSizeF *QGraphicsLayoutItemPrivate::effectiveSizeHints(const QSizeF &constraint) const
{
    Q_Q(const QGraphicsLayoutItem);
    QSizeF *sizeHintCache;
    const bool hasConstraint = constraint.width() >= 0 || constraint.height() >= 0;
    if (hasConstraint) {
        if (!sizeHintWithConstraintCacheDirty && constraint == cachedConstraint)
            return cachedSizeHintsWithConstraints;
        sizeHintCache = cachedSizeHintsWithConstraints;
    } else {
        if (!sizeHintCacheDirty)
            return cachedSizeHints;
        sizeHintCache = cachedSizeHints;
    }

    for (int i = 0; i < Qt::NSizeHints; ++i) {
        sizeHintCache[i] = constraint;
        if (userSizeHints)
            combineSize(sizeHintCache[i], userSizeHints[i]);
    }

    QSizeF &minS = sizeHintCache[Qt::MinimumSize];
    QSizeF &prefS = sizeHintCache[Qt::PreferredSize];
    QSizeF &maxS = sizeHintCache[Qt::MaximumSize];
    QSizeF &descentS = sizeHintCache[Qt::MinimumDescent];

    normalizeHints(minS.rwidth(), prefS.rwidth(), maxS.rwidth(), descentS.rwidth());
    normalizeHints(minS.rheight(), prefS.rheight(), maxS.rheight(), descentS.rheight());

    // if the minimum, preferred and maximum sizes contradict each other
    // (e.g. the minimum is larger than the maximum) we give priority to
    // the maximum size, then the minimum size and finally the preferred size
    COMBINE_SIZE(maxS, q->sizeHint(Qt::MaximumSize, maxS));
    combineSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));
    expandSize(maxS, prefS);
    expandSize(maxS, minS);
    boundSize(maxS, QSizeF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX));

    COMBINE_SIZE(minS, q->sizeHint(Qt::MinimumSize, minS));
    expandSize(minS, QSizeF(0, 0));
    boundSize(minS, prefS);
    boundSize(minS, maxS);

    COMBINE_SIZE(prefS, q->sizeHint(Qt::PreferredSize, prefS));
    expandSize(prefS, minS);
    boundSize(prefS, maxS);

    // Not supported yet
    // COMBINE_SIZE(descentS, q->sizeHint(Qt::MinimumDescent, constraint));

    if (hasConstraint) {
        cachedConstraint = constraint;
        sizeHintWithConstraintCacheDirty = false;
    } else {
        sizeHintCacheDirty = false;
    }
    return sizeHintCache;
}